

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::EnumValueOptions::MergePartialFromCodedStream
          (EnumValueOptions *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  uint8 *puVar5;
  void **ppvVar6;
  bool bVar7;
  Limit limit;
  UninterpretedOption *this_00;
  uint32 tag;
  uint32 local_44;
  UnknownFieldSet *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_unknown_fields_;
  local_38 = &this->_extensions_;
  do {
    while( true ) {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar5 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0x1f3a) break;
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      if (tag < 8000) {
        bVar7 = internal::WireFormat::SkipField(input,tag,local_40);
      }
      else {
        bVar7 = internal::ExtensionSet::ParseField(local_38,tag,input,default_instance_,local_40);
      }
      if (bVar7 == false) {
        return false;
      }
    }
    while( true ) {
      iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (UninterpretedOption *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = this_00;
      }
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
        input->buffer_ = puVar5 + 1;
        local_44 = (int)(char)uVar2;
      }
      else {
        bVar7 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar7) {
          return false;
        }
      }
      iVar3 = input->recursion_depth_;
      input->recursion_depth_ = iVar3 + 1;
      if (input->recursion_limit_ <= iVar3) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_44);
      bVar7 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
      if (!bVar7) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar5 = input->buffer_;
      if ((((int)input->buffer_end_ - (int)puVar5 < 2) || (*puVar5 != 0xba)) || (puVar5[1] != '>'))
      break;
      input->buffer_ = puVar5 + 2;
    }
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  } while( true );
}

Assistant:

bool EnumValueOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}